

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *window_00;
  int i;
  int i_00;
  
  pIVar1 = GImGui;
  i_00 = (GImGui->WindowsFocusOrder).Size + -1;
  if (under_this_window != (ImGuiWindow *)0x0) {
    iVar2 = FindWindowFocusIndex(under_this_window);
    if (iVar2 != -1) {
      i_00 = iVar2 + -1;
    }
  }
  window_00 = (ImGuiWindow *)0x0;
  do {
    if (i_00 < 0) {
LAB_001e617a:
      FocusWindow(window_00);
      return;
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,i_00);
    window = *ppIVar3;
    if ((((window != ignore_window) && (window->WasActive == true)) &&
        (window->RootWindowDockStop == window)) && ((~window->Flags & 0x40200U) != 0)) {
      window_00 = NavRestoreLastChildNavWindow(window);
      goto LAB_001e617a;
    }
    i_00 = i_00 + -1;
  } while( true );
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        int under_this_window_idx = FindWindowFocusIndex(under_this_window);
        if (under_this_window_idx != -1)
            start_idx = under_this_window_idx - 1;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && window->RootWindowDockStop == window)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                // FIXME-DOCK: This is failing (lagging by one frame) for docked windows.
                // If A and B are docked into window and B disappear, at the NewFrame() call site window->NavLastChildNavWindow will still point to B.
                // We might leverage the tab order implicitly stored in window->DockNodeAsHost->TabBar (essentially the 'most_recently_selected_tab' code in tab bar will do that but on next update)
                // to tell which is the "previous" window. Or we may leverage 'LastFrameFocused/LastFrameJustFocused' and have this function handle child window itself?
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}